

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::replace_illegal_names(CompilerGLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_2eab;
  undefined1 local_2eaa;
  undefined1 local_2ea9;
  undefined1 *local_2ea8 [2];
  undefined1 local_2e98 [16];
  undefined1 *local_2e88 [2];
  undefined1 local_2e78 [16];
  undefined1 *local_2e68 [2];
  undefined1 local_2e58 [16];
  undefined1 *local_2e48 [2];
  undefined1 local_2e38 [16];
  undefined1 *local_2e28 [2];
  undefined1 local_2e18 [16];
  undefined1 *local_2e08 [2];
  undefined1 local_2df8 [16];
  undefined1 *local_2de8 [2];
  undefined1 local_2dd8 [16];
  undefined1 *local_2dc8 [2];
  undefined1 local_2db8 [16];
  undefined1 *local_2da8 [2];
  undefined1 local_2d98 [16];
  undefined1 *local_2d88 [2];
  undefined1 local_2d78 [16];
  undefined1 *local_2d68 [2];
  undefined1 local_2d58 [16];
  undefined1 *local_2d48 [2];
  undefined1 local_2d38 [16];
  undefined1 *local_2d28 [2];
  undefined1 local_2d18 [16];
  undefined1 *local_2d08 [2];
  undefined1 local_2cf8 [16];
  undefined1 *local_2ce8 [2];
  undefined1 local_2cd8 [16];
  undefined1 *local_2cc8 [2];
  undefined1 local_2cb8 [16];
  undefined1 *local_2ca8 [2];
  undefined1 local_2c98 [16];
  undefined1 *local_2c88 [2];
  undefined1 local_2c78 [16];
  undefined1 *local_2c68 [2];
  undefined1 local_2c58 [16];
  undefined1 *local_2c48 [2];
  undefined1 local_2c38 [16];
  undefined1 *local_2c28 [2];
  undefined1 local_2c18 [16];
  undefined1 *local_2c08 [2];
  undefined1 local_2bf8 [16];
  undefined1 *local_2be8 [2];
  undefined1 local_2bd8 [16];
  undefined1 *local_2bc8 [2];
  undefined1 local_2bb8 [16];
  undefined1 *local_2ba8 [2];
  undefined1 local_2b98 [16];
  undefined1 *local_2b88 [2];
  undefined1 local_2b78 [16];
  undefined1 *local_2b68 [2];
  undefined1 local_2b58 [16];
  undefined1 *local_2b48 [2];
  undefined1 local_2b38 [16];
  undefined1 *local_2b28 [2];
  undefined1 local_2b18 [16];
  undefined1 *local_2b08 [2];
  undefined1 local_2af8 [16];
  undefined1 *local_2ae8 [2];
  undefined1 local_2ad8 [16];
  undefined1 *local_2ac8 [2];
  undefined1 local_2ab8 [16];
  undefined1 *local_2aa8 [2];
  undefined1 local_2a98 [16];
  undefined1 *local_2a88 [2];
  undefined1 local_2a78 [16];
  undefined1 *local_2a68 [2];
  undefined1 local_2a58 [16];
  undefined1 *local_2a48 [2];
  undefined1 local_2a38 [16];
  undefined1 *local_2a28 [2];
  undefined1 local_2a18 [16];
  undefined1 *local_2a08 [2];
  undefined1 local_29f8 [16];
  undefined1 *local_29e8 [2];
  undefined1 local_29d8 [16];
  undefined1 *local_29c8 [2];
  undefined1 local_29b8 [16];
  undefined1 *local_29a8 [2];
  undefined1 local_2998 [16];
  undefined1 *local_2988 [2];
  undefined1 local_2978 [16];
  undefined1 *local_2968 [2];
  undefined1 local_2958 [16];
  undefined1 *local_2948 [2];
  undefined1 local_2938 [16];
  undefined1 *local_2928 [2];
  undefined1 local_2918 [16];
  undefined1 *local_2908 [2];
  undefined1 local_28f8 [16];
  undefined1 *local_28e8 [2];
  undefined1 local_28d8 [16];
  undefined1 *local_28c8 [2];
  undefined1 local_28b8 [16];
  undefined1 *local_28a8 [2];
  undefined1 local_2898 [16];
  undefined1 *local_2888 [2];
  undefined1 local_2878 [16];
  undefined1 *local_2868 [2];
  undefined1 local_2858 [16];
  undefined1 *local_2848 [2];
  undefined1 local_2838 [16];
  undefined1 *local_2828 [2];
  undefined1 local_2818 [16];
  undefined1 *local_2808 [2];
  undefined1 local_27f8 [16];
  undefined1 *local_27e8 [2];
  undefined1 local_27d8 [16];
  undefined1 *local_27c8 [2];
  undefined1 local_27b8 [16];
  undefined1 *local_27a8 [2];
  undefined1 local_2798 [16];
  undefined1 *local_2788 [2];
  undefined1 local_2778 [16];
  undefined1 *local_2768 [2];
  undefined1 local_2758 [16];
  undefined1 *local_2748 [2];
  undefined1 local_2738 [16];
  undefined1 *local_2728 [2];
  undefined1 local_2718 [16];
  undefined1 *local_2708 [2];
  undefined1 local_26f8 [16];
  undefined1 *local_26e8 [2];
  undefined1 local_26d8 [16];
  undefined1 *local_26c8 [2];
  undefined1 local_26b8 [16];
  undefined1 *local_26a8 [2];
  undefined1 local_2698 [16];
  undefined1 *local_2688 [2];
  undefined1 local_2678 [16];
  undefined1 *local_2668 [2];
  undefined1 local_2658 [16];
  undefined1 *local_2648 [2];
  undefined1 local_2638 [16];
  undefined1 *local_2628 [2];
  undefined1 local_2618 [16];
  undefined1 *local_2608 [2];
  undefined1 local_25f8 [16];
  undefined1 *local_25e8 [2];
  undefined1 local_25d8 [16];
  undefined1 *local_25c8 [2];
  undefined1 local_25b8 [16];
  undefined1 *local_25a8 [2];
  undefined1 local_2598 [16];
  undefined1 *local_2588 [2];
  undefined1 local_2578 [16];
  undefined1 *local_2568 [2];
  undefined1 local_2558 [16];
  undefined1 *local_2548 [2];
  undefined1 local_2538 [16];
  undefined1 *local_2528 [2];
  undefined1 local_2518 [16];
  undefined1 *local_2508 [2];
  undefined1 local_24f8 [16];
  undefined1 *local_24e8 [2];
  undefined1 local_24d8 [16];
  undefined1 *local_24c8 [2];
  undefined1 local_24b8 [16];
  undefined1 *local_24a8 [2];
  undefined1 local_2498 [16];
  undefined1 *local_2488 [2];
  undefined1 local_2478 [16];
  undefined1 *local_2468 [2];
  undefined1 local_2458 [16];
  undefined1 *local_2448 [2];
  undefined1 local_2438 [16];
  undefined1 *local_2428 [2];
  undefined1 local_2418 [16];
  undefined1 *local_2408 [2];
  undefined1 local_23f8 [16];
  undefined1 *local_23e8 [2];
  undefined1 local_23d8 [16];
  undefined1 *local_23c8 [2];
  undefined1 local_23b8 [16];
  undefined1 *local_23a8 [2];
  undefined1 local_2398 [16];
  undefined1 *local_2388 [2];
  undefined1 local_2378 [16];
  undefined1 *local_2368 [2];
  undefined1 local_2358 [16];
  undefined1 *local_2348 [2];
  undefined1 local_2338 [16];
  undefined1 *local_2328 [2];
  undefined1 local_2318 [16];
  undefined1 *local_2308 [2];
  undefined1 local_22f8 [16];
  undefined1 *local_22e8 [2];
  undefined1 local_22d8 [16];
  undefined1 *local_22c8 [2];
  undefined1 local_22b8 [16];
  undefined1 *local_22a8 [2];
  undefined1 local_2298 [16];
  undefined1 *local_2288 [2];
  undefined1 local_2278 [16];
  undefined1 *local_2268 [2];
  undefined1 local_2258 [16];
  undefined1 *local_2248 [2];
  undefined1 local_2238 [16];
  undefined1 *local_2228 [2];
  undefined1 local_2218 [16];
  undefined1 *local_2208 [2];
  undefined1 local_21f8 [16];
  undefined1 *local_21e8 [2];
  undefined1 local_21d8 [16];
  undefined1 *local_21c8 [2];
  undefined1 local_21b8 [16];
  undefined1 *local_21a8 [2];
  undefined1 local_2198 [16];
  undefined1 *local_2188 [2];
  undefined1 local_2178 [16];
  undefined1 *local_2168 [2];
  undefined1 local_2158 [16];
  undefined1 *local_2148 [2];
  undefined1 local_2138 [16];
  undefined1 *local_2128 [2];
  undefined1 local_2118 [16];
  undefined1 *local_2108 [2];
  undefined1 local_20f8 [16];
  undefined1 *local_20e8 [2];
  undefined1 local_20d8 [16];
  undefined1 *local_20c8 [2];
  undefined1 local_20b8 [16];
  undefined1 *local_20a8 [2];
  undefined1 local_2098 [16];
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  undefined1 *local_2068 [2];
  undefined1 local_2058 [16];
  undefined1 *local_2048 [2];
  undefined1 local_2038 [16];
  undefined1 *local_2028 [2];
  undefined1 local_2018 [16];
  undefined1 *local_2008 [2];
  undefined1 local_1ff8 [16];
  undefined1 *local_1fe8 [2];
  undefined1 local_1fd8 [16];
  undefined1 *local_1fc8 [2];
  undefined1 local_1fb8 [16];
  undefined1 *local_1fa8 [2];
  undefined1 local_1f98 [16];
  undefined1 *local_1f88 [2];
  undefined1 local_1f78 [16];
  undefined1 *local_1f68 [2];
  undefined1 local_1f58 [16];
  undefined1 *local_1f48 [2];
  undefined1 local_1f38 [16];
  undefined1 *local_1f28 [2];
  undefined1 local_1f18 [16];
  undefined1 *local_1f08 [2];
  undefined1 local_1ef8 [16];
  undefined1 *local_1ee8 [2];
  undefined1 local_1ed8 [16];
  undefined1 *local_1ec8 [2];
  undefined1 local_1eb8 [16];
  undefined1 *local_1ea8 [2];
  undefined1 local_1e98 [16];
  undefined1 *local_1e88 [2];
  undefined1 local_1e78 [16];
  undefined1 *local_1e68 [2];
  undefined1 local_1e58 [16];
  undefined1 *local_1e48 [2];
  undefined1 local_1e38 [16];
  undefined1 *local_1e28 [2];
  undefined1 local_1e18 [16];
  undefined1 *local_1e08 [2];
  undefined1 local_1df8 [16];
  undefined1 *local_1de8 [2];
  undefined1 local_1dd8 [16];
  undefined1 *local_1dc8 [2];
  undefined1 local_1db8 [16];
  undefined1 *local_1da8 [2];
  undefined1 local_1d98 [16];
  undefined1 *local_1d88 [2];
  undefined1 local_1d78 [16];
  undefined1 *local_1d68 [2];
  undefined1 local_1d58 [16];
  undefined1 *local_1d48 [2];
  undefined1 local_1d38 [16];
  undefined1 *local_1d28 [2];
  undefined1 local_1d18 [16];
  undefined1 *local_1d08 [2];
  undefined1 local_1cf8 [16];
  undefined1 *local_1ce8 [2];
  undefined1 local_1cd8 [16];
  undefined1 *local_1cc8 [2];
  undefined1 local_1cb8 [16];
  undefined1 *local_1ca8 [2];
  undefined1 local_1c98 [16];
  undefined1 *local_1c88 [2];
  undefined1 local_1c78 [16];
  undefined1 *local_1c68 [2];
  undefined1 local_1c58 [16];
  undefined1 *local_1c48 [2];
  undefined1 local_1c38 [16];
  undefined1 *local_1c28 [2];
  undefined1 local_1c18 [16];
  undefined1 *local_1c08 [2];
  undefined1 local_1bf8 [16];
  undefined1 *local_1be8 [2];
  undefined1 local_1bd8 [16];
  undefined1 *local_1bc8 [2];
  undefined1 local_1bb8 [16];
  undefined1 *local_1ba8 [2];
  undefined1 local_1b98 [16];
  undefined1 *local_1b88 [2];
  undefined1 local_1b78 [16];
  undefined1 *local_1b68 [2];
  undefined1 local_1b58 [16];
  undefined1 *local_1b48 [2];
  undefined1 local_1b38 [16];
  undefined1 *local_1b28 [2];
  undefined1 local_1b18 [16];
  undefined1 *local_1b08 [2];
  undefined1 local_1af8 [16];
  undefined1 *local_1ae8 [2];
  undefined1 local_1ad8 [16];
  undefined1 *local_1ac8 [2];
  undefined1 local_1ab8 [16];
  undefined1 *local_1aa8 [2];
  undefined1 local_1a98 [16];
  undefined1 *local_1a88 [2];
  undefined1 local_1a78 [16];
  undefined1 *local_1a68 [2];
  undefined1 local_1a58 [16];
  undefined1 *local_1a48 [2];
  undefined1 local_1a38 [16];
  undefined1 *local_1a28 [2];
  undefined1 local_1a18 [16];
  undefined1 *local_1a08 [2];
  undefined1 local_19f8 [16];
  undefined1 *local_19e8 [2];
  undefined1 local_19d8 [16];
  undefined1 *local_19c8 [2];
  undefined1 local_19b8 [16];
  undefined1 *local_19a8 [2];
  undefined1 local_1998 [16];
  undefined1 *local_1988 [2];
  undefined1 local_1978 [16];
  undefined1 *local_1968 [2];
  undefined1 local_1958 [16];
  undefined1 *local_1948 [2];
  undefined1 local_1938 [16];
  undefined1 *local_1928 [2];
  undefined1 local_1918 [16];
  undefined1 *local_1908 [2];
  undefined1 local_18f8 [16];
  undefined1 *local_18e8 [2];
  undefined1 local_18d8 [16];
  undefined1 *local_18c8 [2];
  undefined1 local_18b8 [16];
  undefined1 *local_18a8 [2];
  undefined1 local_1898 [16];
  undefined1 *local_1888 [2];
  undefined1 local_1878 [16];
  undefined1 *local_1868 [2];
  undefined1 local_1858 [16];
  undefined1 *local_1848 [2];
  undefined1 local_1838 [16];
  undefined1 *local_1828 [2];
  undefined1 local_1818 [16];
  undefined1 *local_1808 [2];
  undefined1 local_17f8 [16];
  undefined1 *local_17e8 [2];
  undefined1 local_17d8 [16];
  undefined1 *local_17c8 [2];
  undefined1 local_17b8 [16];
  undefined1 *local_17a8 [2];
  undefined1 local_1798 [16];
  undefined1 *local_1788 [2];
  undefined1 local_1778 [16];
  undefined1 *local_1768 [2];
  undefined1 local_1758 [16];
  undefined1 *local_1748 [2];
  undefined1 local_1738 [16];
  undefined1 *local_1728 [2];
  undefined1 local_1718 [16];
  undefined1 *local_1708 [2];
  undefined1 local_16f8 [16];
  undefined1 *local_16e8 [2];
  undefined1 local_16d8 [16];
  undefined1 *local_16c8 [2];
  undefined1 local_16b8 [16];
  undefined1 *local_16a8 [2];
  undefined1 local_1698 [16];
  undefined1 *local_1688 [2];
  undefined1 local_1678 [16];
  undefined1 *local_1668 [2];
  undefined1 local_1658 [16];
  undefined1 *local_1648 [2];
  undefined1 local_1638 [16];
  undefined1 *local_1628 [2];
  undefined1 local_1618 [16];
  undefined1 *local_1608 [2];
  undefined1 local_15f8 [16];
  undefined1 *local_15e8 [2];
  undefined1 local_15d8 [16];
  undefined1 *local_15c8 [2];
  undefined1 local_15b8 [16];
  undefined1 *local_15a8 [2];
  undefined1 local_1598 [16];
  undefined1 *local_1588 [2];
  undefined1 local_1578 [16];
  undefined1 *local_1568 [2];
  undefined1 local_1558 [16];
  undefined1 *local_1548 [2];
  undefined1 local_1538 [16];
  undefined1 *local_1528 [2];
  undefined1 local_1518 [16];
  undefined1 *local_1508 [2];
  undefined1 local_14f8 [16];
  undefined1 *local_14e8 [2];
  undefined1 local_14d8 [16];
  undefined1 *local_14c8 [2];
  undefined1 local_14b8 [16];
  undefined1 *local_14a8 [2];
  undefined1 local_1498 [16];
  undefined1 *local_1488 [2];
  undefined1 local_1478 [16];
  undefined1 *local_1468 [2];
  undefined1 local_1458 [16];
  undefined1 *local_1448 [2];
  undefined1 local_1438 [16];
  undefined1 *local_1428 [2];
  undefined1 local_1418 [16];
  undefined1 *local_1408 [2];
  undefined1 local_13f8 [16];
  undefined1 *local_13e8 [2];
  undefined1 local_13d8 [16];
  undefined1 *local_13c8 [2];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8 [2];
  undefined1 local_1398 [16];
  undefined1 *local_1388 [2];
  undefined1 local_1378 [16];
  undefined1 *local_1368 [2];
  undefined1 local_1358 [16];
  undefined1 *local_1348 [2];
  undefined1 local_1338 [16];
  undefined1 *local_1328 [2];
  undefined1 local_1318 [16];
  undefined1 *local_1308 [2];
  undefined1 local_12f8 [16];
  undefined1 *local_12e8 [2];
  undefined1 local_12d8 [16];
  undefined1 *local_12c8 [2];
  undefined1 local_12b8 [16];
  undefined1 *local_12a8 [2];
  undefined1 local_1298 [16];
  undefined1 *local_1288 [2];
  undefined1 local_1278 [16];
  undefined1 *local_1268 [2];
  undefined1 local_1258 [16];
  undefined1 *local_1248 [2];
  undefined1 local_1238 [16];
  undefined1 *local_1228 [2];
  undefined1 local_1218 [16];
  undefined1 *local_1208 [2];
  undefined1 local_11f8 [16];
  undefined1 *local_11e8 [2];
  undefined1 local_11d8 [16];
  undefined1 *local_11c8 [2];
  undefined1 local_11b8 [16];
  undefined1 *local_11a8 [2];
  undefined1 local_1198 [16];
  undefined1 *local_1188 [2];
  undefined1 local_1178 [16];
  undefined1 *local_1168 [2];
  undefined1 local_1158 [16];
  undefined1 *local_1148 [2];
  undefined1 local_1138 [16];
  undefined1 *local_1128 [2];
  undefined1 local_1118 [16];
  undefined1 *local_1108 [2];
  undefined1 local_10f8 [16];
  undefined1 *local_10e8 [2];
  undefined1 local_10d8 [16];
  undefined1 *local_10c8 [2];
  undefined1 local_10b8 [16];
  undefined1 *local_10a8 [2];
  undefined1 local_1098 [16];
  undefined1 *local_1088 [2];
  undefined1 local_1078 [16];
  undefined1 *local_1068 [2];
  undefined1 local_1058 [16];
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  undefined1 *local_1028 [2];
  undefined1 local_1018 [16];
  undefined1 *local_1008 [2];
  undefined1 local_ff8 [16];
  undefined1 *local_fe8 [2];
  undefined1 local_fd8 [16];
  undefined1 *local_fc8 [2];
  undefined1 local_fb8 [16];
  undefined1 *local_fa8 [2];
  undefined1 local_f98 [16];
  undefined1 *local_f88 [2];
  undefined1 local_f78 [16];
  undefined1 *local_f68 [2];
  undefined1 local_f58 [16];
  undefined1 *local_f48 [2];
  undefined1 local_f38 [16];
  undefined1 *local_f28 [2];
  undefined1 local_f18 [16];
  undefined1 *local_f08 [2];
  undefined1 local_ef8 [16];
  undefined1 *local_ee8 [2];
  undefined1 local_ed8 [16];
  undefined1 *local_ec8 [2];
  undefined1 local_eb8 [16];
  undefined1 *local_ea8 [2];
  undefined1 local_e98 [16];
  undefined1 *local_e88 [2];
  undefined1 local_e78 [16];
  undefined1 *local_e68 [2];
  undefined1 local_e58 [16];
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  undefined1 *local_e08 [2];
  undefined1 local_df8 [16];
  undefined1 *local_de8 [2];
  undefined1 local_dd8 [16];
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  undefined1 *local_da8 [2];
  undefined1 local_d98 [16];
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  undefined1 *local_d68 [2];
  undefined1 local_d58 [16];
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  undefined1 *local_d28 [2];
  undefined1 local_d18 [16];
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  undefined1 *local_ce8 [2];
  undefined1 local_cd8 [16];
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined1 *local_ca8 [2];
  undefined1 local_c98 [16];
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  undefined1 *local_be8 [2];
  undefined1 local_bd8 [16];
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  undefined1 *local_ba8 [2];
  undefined1 local_b98 [16];
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 *local_b08 [2];
  undefined1 local_af8 [16];
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined1 *local_ac8 [2];
  undefined1 local_ab8 [16];
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  undefined1 *local_a88 [2];
  undefined1 local_a78 [16];
  undefined1 *local_a68 [2];
  undefined1 local_a58 [16];
  undefined1 *local_a48 [2];
  undefined1 local_a38 [16];
  undefined1 *local_a28 [2];
  undefined1 local_a18 [16];
  undefined1 *local_a08 [2];
  undefined1 local_9f8 [16];
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  undefined1 *local_8e8 [2];
  undefined1 local_8d8 [16];
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [16];
  undefined1 *local_8a8 [2];
  undefined1 local_898 [16];
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  undefined1 *local_868 [2];
  undefined1 local_858 [16];
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_2ea8[0] = local_2e98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ea8,"abs","");
      local_2e88[0] = local_2e78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e88,"acos","");
      local_2e68[0] = local_2e58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e68,"acosh","");
      local_2e48[0] = local_2e38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e48,"all","");
      local_2e28[0] = local_2e18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e28,"any","");
      local_2e08[0] = local_2df8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e08,"asin","");
      local_2de8[0] = local_2dd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2de8,"asinh","");
      local_2dc8[0] = local_2db8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2dc8,"atan","");
      local_2da8[0] = local_2d98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2da8,"atanh","");
      local_2d88[0] = local_2d78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d88,"atomicAdd","");
      local_2d68[0] = local_2d58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d68,"atomicCompSwap","");
      local_2d48[0] = local_2d38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d48,"atomicCounter","");
      local_2d28[0] = local_2d18;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d28,"atomicCounterDecrement","");
      local_2d08[0] = local_2cf8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d08,"atomicCounterIncrement","");
      local_2ce8[0] = local_2cd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ce8,"atomicExchange","");
      local_2cc8[0] = local_2cb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2cc8,"atomicMax","");
      local_2ca8[0] = local_2c98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ca8,"atomicMin","");
      local_2c88[0] = local_2c78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c88,"atomicOr","");
      local_2c68[0] = local_2c58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c68,"atomicXor","");
      local_2c48[0] = local_2c38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c48,"bitCount","");
      local_2c28[0] = local_2c18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c28,"bitfieldExtract","");
      local_2c08[0] = local_2bf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c08,"bitfieldInsert","");
      local_2be8[0] = local_2bd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2be8,"bitfieldReverse","");
      local_2bc8[0] = local_2bb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2bc8,"ceil","");
      local_2ba8[0] = local_2b98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ba8,"cos","");
      local_2b88[0] = local_2b78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b88,"cosh","");
      local_2b68[0] = local_2b58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b68,"cross","");
      local_2b48[0] = local_2b38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b48,"degrees","");
      local_2b28[0] = local_2b18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b28,"dFdx","");
      local_2b08[0] = local_2af8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b08,"dFdxCoarse","");
      local_2ae8[0] = local_2ad8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ae8,"dFdxFine","");
      local_2ac8[0] = local_2ab8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ac8,"dFdy","");
      local_2aa8[0] = local_2a98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2aa8,"dFdyCoarse","");
      local_2a88[0] = local_2a78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a88,"dFdyFine","");
      local_2a68[0] = local_2a58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a68,"distance","");
      local_2a48[0] = local_2a38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a48,"dot","");
      local_2a28[0] = local_2a18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a28,"EmitStreamVertex","");
      local_2a08[0] = local_29f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a08,"EmitVertex","");
      local_29e8[0] = local_29d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_29e8,"EndPrimitive","");
      local_29c8[0] = local_29b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_29c8,"EndStreamPrimitive","");
      local_29a8[0] = local_2998;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_29a8,"equal","");
      local_2988[0] = local_2978;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2988,"exp","");
      local_2968[0] = local_2958;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2968,"exp2","");
      local_2948[0] = local_2938;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2948,"faceforward","");
      local_2928[0] = local_2918;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2928,"findLSB","");
      local_2908[0] = local_28f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2908,"findMSB","");
      local_28e8[0] = local_28d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_28e8,"float16BitsToInt16","");
      local_28c8[0] = local_28b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_28c8,"float16BitsToUint16","");
      local_28a8[0] = local_2898;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_28a8,"floatBitsToInt","");
      local_2888[0] = local_2878;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2888,"floatBitsToUint","");
      local_2868[0] = local_2858;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2868,"floor","");
      local_2848[0] = local_2838;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2848,"fma","");
      local_2828[0] = local_2818;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2828,"fract","");
      local_2808[0] = local_27f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2808,"frexp","");
      local_27e8[0] = local_27d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27e8,"fwidth","");
      local_27c8[0] = local_27b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27c8,"fwidthCoarse","");
      local_27a8[0] = local_2798;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27a8,"fwidthFine","");
      local_2788[0] = local_2778;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2788,"greaterThan","");
      local_2768[0] = local_2758;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2768,"greaterThanEqual","");
      local_2748[0] = local_2738;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2748,"groupMemoryBarrier","");
      local_2728[0] = local_2718;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2728,"imageAtomicAdd","");
      local_2708[0] = local_26f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2708,"imageAtomicAnd","");
      local_26e8[0] = local_26d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_26e8,"imageAtomicCompSwap","");
      local_26c8[0] = local_26b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_26c8,"imageAtomicExchange","");
      local_26a8[0] = local_2698;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_26a8,"imageAtomicMax","");
      local_2688[0] = local_2678;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2688,"imageAtomicMin","");
      local_2668[0] = local_2658;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2668,"imageAtomicOr","");
      local_2648[0] = local_2638;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2648,"imageAtomicXor","");
      local_2628[0] = local_2618;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2628,"imageLoad","");
      local_2608[0] = local_25f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2608,"imageSamples","");
      local_25e8[0] = local_25d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25e8,"imageSize","");
      local_25c8[0] = local_25b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25c8,"imageStore","");
      local_25a8[0] = local_2598;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25a8,"imulExtended","");
      local_2588[0] = local_2578;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2588,"int16BitsToFloat16","");
      local_2568[0] = local_2558;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2568,"intBitsToFloat","");
      local_2548[0] = local_2538;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2548,"interpolateAtOffset","");
      local_2528[0] = local_2518;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2528,"interpolateAtCentroid","");
      local_2508[0] = local_24f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2508,"interpolateAtSample","");
      local_24e8[0] = local_24d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24e8,"inverse","");
      local_24c8[0] = local_24b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24c8,"inversesqrt","");
      local_24a8[0] = local_2498;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24a8,"isinf","");
      local_2488[0] = local_2478;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2488,"isnan","");
      local_2468[0] = local_2458;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2468,"ldexp","");
      local_2448[0] = local_2438;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2448,"length","");
      local_2428[0] = local_2418;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2428,"lessThan","");
      local_2408[0] = local_23f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2408,"lessThanEqual","");
      local_23e8[0] = local_23d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23e8,"log","");
      local_23c8[0] = local_23b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"log2","");
      local_23a8[0] = local_2398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23a8,"matrixCompMult","");
      local_2388[0] = local_2378;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2388,"max","");
      local_2368[0] = local_2358;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2368,"memoryBarrier","");
      local_2348[0] = local_2338;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2348,"memoryBarrierAtomicCounter","");
      local_2328[0] = local_2318;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2328,"memoryBarrierBuffer","");
      local_2308[0] = local_22f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2308,"memoryBarrierImage","");
      local_22e8[0] = local_22d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_22e8,"memoryBarrierShared","");
      local_22c8[0] = local_22b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_22c8,"min","");
      local_22a8[0] = local_2298;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_22a8,"mix","");
      local_2288[0] = local_2278;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2288,"mod","");
      local_2268[0] = local_2258;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2268,"modf","");
      local_2248[0] = local_2238;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2248,"noise","");
      local_2228[0] = local_2218;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2228,"noise1","");
      local_2208[0] = local_21f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2208,"noise2","");
      local_21e8[0] = local_21d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21e8,"noise3","");
      local_21c8[0] = local_21b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21c8,"noise4","");
      local_21a8[0] = local_2198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21a8,"normalize","");
      local_2188[0] = local_2178;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2188,"not","");
      local_2168[0] = local_2158;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2168,"notEqual","");
      local_2148[0] = local_2138;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2148,"outerProduct","");
      local_2128[0] = local_2118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2128,"packDouble2x32","");
      local_2108[0] = local_20f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2108,"packHalf2x16","");
      local_20e8[0] = local_20d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20e8,"packInt2x16","");
      local_20c8[0] = local_20b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20c8,"packInt4x16","");
      local_20a8[0] = local_2098;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20a8,"packSnorm2x16","");
      local_2088[0] = local_2078;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2088,"packSnorm4x8","");
      local_2068[0] = local_2058;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2068,"packUint2x16","");
      local_2048[0] = local_2038;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2048,"packUint4x16","");
      local_2028[0] = local_2018;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2028,"packUnorm2x16","");
      local_2008[0] = local_1ff8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2008,"packUnorm4x8","");
      local_1fe8[0] = local_1fd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fe8,"pow","");
      local_1fc8[0] = local_1fb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fc8,"radians","");
      local_1fa8[0] = local_1f98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa8,"reflect","");
      local_1f88[0] = local_1f78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f88,"refract","");
      local_1f68[0] = local_1f58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f68,"round","");
      local_1f48[0] = local_1f38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f48,"roundEven","");
      local_1f28[0] = local_1f18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f28,"sign","");
      local_1f08[0] = local_1ef8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f08,"sin","");
      local_1ee8[0] = local_1ed8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ee8,"sinh","");
      local_1ec8[0] = local_1eb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ec8,"smoothstep","");
      local_1ea8[0] = local_1e98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ea8,"sqrt","");
      local_1e88[0] = local_1e78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e88,"step","");
      local_1e68[0] = local_1e58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e68,"tan","");
      local_1e48[0] = local_1e38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e48,"tanh","");
      local_1e28[0] = local_1e18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e28,"texelFetch","");
      local_1e08[0] = local_1df8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e08,"texelFetchOffset","");
      local_1de8[0] = local_1dd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1de8,"texture","");
      local_1dc8[0] = local_1db8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1dc8,"textureGather","");
      local_1da8[0] = local_1d98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1da8,"textureGatherOffset","");
      local_1d88[0] = local_1d78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d88,"textureGatherOffsets","");
      local_1d68[0] = local_1d58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d68,"textureGrad","");
      local_1d48[0] = local_1d38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d48,"textureGradOffset","")
      ;
      local_1d28[0] = local_1d18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d28,"textureLod","");
      local_1d08[0] = local_1cf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d08,"textureLodOffset","");
      local_1ce8[0] = local_1cd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ce8,"textureOffset","");
      local_1cc8[0] = local_1cb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1cc8,"textureProj","");
      local_1ca8[0] = local_1c98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ca8,"textureProjGrad","");
      local_1c88[0] = local_1c78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c88,"textureProjGradOffset","");
      local_1c68[0] = local_1c58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c68,"textureProjLod","");
      local_1c48[0] = local_1c38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c48,"textureProjLodOffset","");
      local_1c28[0] = local_1c18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c28,"textureProjOffset","")
      ;
      local_1c08[0] = local_1bf8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c08,"textureQueryLevels","");
      local_1be8[0] = local_1bd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1be8,"textureQueryLod","");
      local_1bc8[0] = local_1bb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1bc8,"textureSamples","");
      local_1ba8[0] = local_1b98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ba8,"textureSize","");
      local_1b88[0] = local_1b78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b88,"transpose","");
      local_1b68[0] = local_1b58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b68,"trunc","");
      local_1b48[0] = local_1b38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b48,"uaddCarry","");
      local_1b28[0] = local_1b18;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b28,"uint16BitsToFloat16","");
      local_1b08[0] = local_1af8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b08,"uintBitsToFloat","");
      local_1ae8[0] = local_1ad8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ae8,"umulExtended","");
      local_1ac8[0] = local_1ab8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ac8,"unpackDouble2x32","");
      local_1aa8[0] = local_1a98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1aa8,"unpackHalf2x16","");
      local_1a88[0] = local_1a78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a88,"unpackInt2x16","");
      local_1a68[0] = local_1a58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a68,"unpackInt4x16","");
      local_1a48[0] = local_1a38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a48,"unpackSnorm2x16","");
      local_1a28[0] = local_1a18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a28,"unpackSnorm4x8","");
      local_1a08[0] = local_19f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a08,"unpackUint2x16","");
      local_19e8[0] = local_19d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19e8,"unpackUint4x16","");
      local_19c8[0] = local_19b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19c8,"unpackUnorm2x16","");
      local_19a8[0] = local_1998;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19a8,"unpackUnorm4x8","");
      local_1988[0] = local_1978;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1988,"usubBorrow","");
      local_1968[0] = local_1958;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1968,"active","");
      local_1948[0] = local_1938;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1948,"asm","");
      local_1928[0] = local_1918;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1928,"atomic_uint","");
      local_1908[0] = local_18f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"attribute","");
      local_18e8[0] = local_18d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18e8,"bool","");
      local_18c8[0] = local_18b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"break","");
      local_18a8[0] = local_1898;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18a8,"buffer","");
      local_1888[0] = local_1878;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1888,"bvec2","");
      local_1868[0] = local_1858;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1868,"bvec3","");
      local_1848[0] = local_1838;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1848,"bvec4","");
      local_1828[0] = local_1818;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1828,"case","");
      local_1808[0] = local_17f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1808,"cast","");
      local_17e8[0] = local_17d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17e8,"centroid","");
      local_17c8[0] = local_17b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17c8,"class","");
      local_17a8[0] = local_1798;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17a8,"coherent","");
      local_1788[0] = local_1778;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1788,"common","");
      local_1768[0] = local_1758;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1768,"const","");
      local_1748[0] = local_1738;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1748,"continue","");
      local_1728[0] = local_1718;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1728,"default","");
      local_1708[0] = local_16f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1708,"discard","");
      local_16e8[0] = local_16d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16e8,"dmat2","");
      local_16c8[0] = local_16b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16c8,"dmat2x2","");
      local_16a8[0] = local_1698;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16a8,"dmat2x3","");
      local_1688[0] = local_1678;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1688,"dmat2x4","");
      local_1668[0] = local_1658;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1668,"dmat3","");
      local_1648[0] = local_1638;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1648,"dmat3x2","");
      local_1628[0] = local_1618;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1628,"dmat3x3","");
      local_1608[0] = local_15f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1608,"dmat3x4","");
      local_15e8[0] = local_15d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15e8,"dmat4","");
      local_15c8[0] = local_15b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15c8,"dmat4x2","");
      local_15a8[0] = local_1598;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15a8,"dmat4x3","");
      local_1588[0] = local_1578;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1588,"dmat4x4","");
      local_1568[0] = local_1558;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1568,"do","");
      local_1548[0] = local_1538;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1548,"double","");
      local_1528[0] = local_1518;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1528,"dvec2","");
      local_1508[0] = local_14f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"dvec3","");
      local_14e8[0] = local_14d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"dvec4","");
      local_14c8[0] = local_14b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,"else","");
      local_14a8[0] = local_1498;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"enum","");
      local_1488[0] = local_1478;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1488,"extern","");
      local_1468[0] = local_1458;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"external","");
      local_1448[0] = local_1438;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1448,"false","");
      local_1428[0] = local_1418;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1428,"filter","");
      local_1408[0] = local_13f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"fixed","");
      local_13e8[0] = local_13d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"flat","");
      local_13c8[0] = local_13b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13c8,"float","");
      local_13a8[0] = local_1398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13a8,"for","");
      local_1388[0] = local_1378;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,"fvec2","");
      local_1368[0] = local_1358;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"fvec3","");
      local_1348[0] = local_1338;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,"fvec4","");
      local_1328[0] = local_1318;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1328,"goto","");
      local_1308[0] = local_12f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1308,"half","");
      local_12e8[0] = local_12d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12e8,"highp","");
      local_12c8[0] = local_12b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"hvec2","");
      local_12a8[0] = local_1298;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,"hvec3","");
      local_1288[0] = local_1278;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"hvec4","");
      local_1268[0] = local_1258;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1268,"if","");
      local_1248[0] = local_1238;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,"iimage1D","");
      local_1228[0] = local_1218;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1228,"iimage1DArray","");
      local_1208[0] = local_11f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1208,"iimage2D","");
      local_11e8[0] = local_11d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11e8,"iimage2DArray","");
      local_11c8[0] = local_11b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,"iimage2DMS","");
      local_11a8[0] = local_1198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"iimage2DMSArray","");
      local_1188[0] = local_1178;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1188,"iimage2DRect","");
      local_1168[0] = local_1158;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"iimage3D","");
      local_1148[0] = local_1138;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1148,"iimageBuffer","");
      local_1128[0] = local_1118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"iimageCube","");
      local_1108[0] = local_10f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1108,"iimageCubeArray","");
      local_10e8[0] = local_10d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10e8,"image1D","");
      local_10c8[0] = local_10b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10c8,"image1DArray","");
      local_10a8[0] = local_1098;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10a8,"image2D","");
      local_1088[0] = local_1078;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1088,"image2DArray","");
      local_1068[0] = local_1058;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1068,"image2DMS","");
      local_1048[0] = local_1038;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1048,"image2DMSArray","");
      local_1028[0] = local_1018;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1028,"image2DRect","");
      local_1008[0] = local_ff8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1008,"image3D","");
      local_fe8[0] = local_fd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"imageBuffer","");
      local_fc8[0] = local_fb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,"imageCube","");
      local_fa8[0] = local_f98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"imageCubeArray","");
      local_f88[0] = local_f78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"in","");
      local_f68[0] = local_f58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"inline","");
      local_f48[0] = local_f38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"inout","");
      local_f28[0] = local_f18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"input","");
      local_f08[0] = local_ef8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f08,"int","");
      local_ee8[0] = local_ed8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ee8,"interface","");
      local_ec8[0] = local_eb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ec8,"invariant","");
      local_ea8[0] = local_e98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ea8,"isampler1D","");
      local_e88[0] = local_e78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,"isampler1DArray","");
      local_e68[0] = local_e58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,"isampler2D","");
      local_e48[0] = local_e38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"isampler2DArray","");
      local_e28[0] = local_e18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"isampler2DMS","");
      local_e08[0] = local_df8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"isampler2DMSArray","");
      local_de8[0] = local_dd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"isampler2DRect","");
      local_dc8[0] = local_db8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"isampler3D","");
      local_da8[0] = local_d98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_da8,"isamplerBuffer","");
      local_d88[0] = local_d78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"isamplerCube","");
      local_d68[0] = local_d58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d68,"isamplerCubeArray","");
      local_d48[0] = local_d38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"ivec2","");
      local_d28[0] = local_d18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"ivec3","");
      local_d08[0] = local_cf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"ivec4","");
      local_ce8[0] = local_cd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"layout","");
      local_cc8[0] = local_cb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"long","");
      local_ca8[0] = local_c98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"lowp","");
      local_c88[0] = local_c78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"mat2","");
      local_c68[0] = local_c58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"mat2x2","");
      local_c48[0] = local_c38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"mat2x3","");
      local_c28[0] = local_c18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"mat2x4","");
      local_c08[0] = local_bf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"mat3","");
      local_be8[0] = local_bd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"mat3x2","");
      local_bc8[0] = local_bb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"mat3x3","");
      local_ba8[0] = local_b98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"mat3x4","");
      local_b88[0] = local_b78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"mat4","");
      local_b68[0] = local_b58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"mat4x2","");
      local_b48[0] = local_b38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"mat4x3","");
      local_b28[0] = local_b18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"mat4x4","");
      local_b08[0] = local_af8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,"mediump","");
      local_ae8[0] = local_ad8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"namespace","");
      local_ac8[0] = local_ab8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"noinline","");
      local_aa8[0] = local_a98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"noperspective","");
      local_a88[0] = local_a78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"out","");
      local_a68[0] = local_a58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"output","");
      local_a48[0] = local_a38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"packed","");
      local_a28[0] = local_a18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"partition","");
      local_a08[0] = local_9f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"patch","");
      local_9e8[0] = local_9d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"precise","");
      local_9c8[0] = local_9b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"precision","");
      local_9a8[0] = local_998;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"public","");
      local_988[0] = local_978;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"readonly","");
      local_968[0] = local_958;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"resource","");
      local_948[0] = local_938;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"restrict","");
      local_928[0] = local_918;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"return","");
      local_908[0] = local_8f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"sample","");
      local_8e8[0] = local_8d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"sampler1D","");
      local_8c8[0] = local_8b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"sampler1DArray","");
      local_8a8[0] = local_898;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8a8,"sampler1DArrayShadow","");
      local_888[0] = local_878;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"sampler1DShadow","");
      local_868[0] = local_858;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"sampler2D","");
      local_848[0] = local_838;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"sampler2DArray","");
      local_828[0] = local_818;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_828,"sampler2DArrayShadow","");
      local_808[0] = local_7f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"sampler2DMS","");
      local_7e8[0] = local_7d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"sampler2DMSArray","");
      local_7c8[0] = local_7b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"sampler2DRect","");
      local_7a8[0] = local_798;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7a8,"sampler2DRectShadow","");
      local_788[0] = local_778;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"sampler2DShadow","");
      local_768[0] = local_758;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"sampler3D","");
      local_748[0] = local_738;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"sampler3DRect","");
      local_728[0] = local_718;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"samplerBuffer","");
      local_708[0] = local_6f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"samplerCube","");
      local_6e8[0] = local_6d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"samplerCubeArray","");
      local_6c8[0] = local_6b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6c8,"samplerCubeArrayShadow","");
      local_6a8[0] = local_698;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"samplerCubeShadow","");
      local_688[0] = local_678;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"shared","");
      local_668[0] = local_658;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"short","");
      local_648[0] = local_638;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"sizeof","");
      local_628[0] = local_618;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"smooth","");
      local_608[0] = local_5f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"static","");
      local_5e8[0] = local_5d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"struct","");
      local_5c8[0] = local_5b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"subroutine","");
      local_5a8[0] = local_598;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"superp","");
      local_588[0] = local_578;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"switch","");
      local_568[0] = local_558;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"template","");
      local_548[0] = local_538;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"this","");
      local_528[0] = local_518;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"true","");
      local_508[0] = local_4f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"typedef","");
      local_4e8[0] = local_4d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"uimage1D","");
      local_4c8[0] = local_4b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"uimage1DArray","");
      local_4a8[0] = local_498;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"uimage2D","");
      local_488[0] = local_478;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"uimage2DArray","");
      local_468[0] = local_458;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"uimage2DMS","");
      local_448[0] = local_438;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"uimage2DMSArray","");
      local_428[0] = local_418;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"uimage2DRect","");
      local_408[0] = local_3f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"uimage3D","");
      local_3e8[0] = local_3d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"uimageBuffer","");
      local_3c8[0] = local_3b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"uimageCube","");
      local_3a8[0] = local_398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"uimageCubeArray","");
      local_388[0] = local_378;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"uint","");
      local_368[0] = local_358;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"uniform","");
      local_348[0] = local_338;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"union","");
      local_328[0] = local_318;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"unsigned","");
      local_308[0] = local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"usampler1D","");
      local_2e8[0] = local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"usampler1DArray","");
      local_2c8[0] = local_2b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"usampler2D","");
      local_2a8[0] = local_298;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"usampler2DArray","");
      local_288[0] = local_278;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"usampler2DMS","");
      local_268[0] = local_258;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"usampler2DMSArray","");
      local_248[0] = local_238;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"usampler2DRect","");
      local_228[0] = local_218;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"usampler3D","");
      local_208[0] = local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"usamplerBuffer","");
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"usamplerCube","");
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"usamplerCubeArray","");
      local_1a8[0] = local_198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"using","");
      local_188[0] = local_178;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"uvec2","");
      local_168[0] = local_158;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"uvec3","");
      local_148[0] = local_138;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"uvec4","");
      local_128[0] = local_118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"varying","");
      local_108[0] = local_f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"vec2","");
      local_e8[0] = local_d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"vec3","");
      local_c8[0] = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"vec4","");
      local_a8[0] = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"void","");
      local_88[0] = local_78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"volatile","");
      local_68[0] = local_58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"while","");
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"writeonly","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_2ea8,
                 &stack0xffffffffffffffd8,0,&local_2ea9,&local_2eaa,&local_2eab);
      lVar2 = 0;
      do {
        if (local_38 + lVar2 != *(undefined1 **)((long)local_48 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x2e80);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  replace_illegal_names(this,&replace_illegal_names()::keywords_abi_cxx11_);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names()
{
	// clang-format off
	static const unordered_set<string> keywords = {
		"abs", "acos", "acosh", "all", "any", "asin", "asinh", "atan", "atanh",
		"atomicAdd", "atomicCompSwap", "atomicCounter", "atomicCounterDecrement", "atomicCounterIncrement",
		"atomicExchange", "atomicMax", "atomicMin", "atomicOr", "atomicXor",
		"bitCount", "bitfieldExtract", "bitfieldInsert", "bitfieldReverse",
		"ceil", "cos", "cosh", "cross", "degrees",
		"dFdx", "dFdxCoarse", "dFdxFine",
		"dFdy", "dFdyCoarse", "dFdyFine",
		"distance", "dot", "EmitStreamVertex", "EmitVertex", "EndPrimitive", "EndStreamPrimitive", "equal", "exp", "exp2",
		"faceforward", "findLSB", "findMSB", "float16BitsToInt16", "float16BitsToUint16", "floatBitsToInt", "floatBitsToUint", "floor", "fma", "fract",
		"frexp", "fwidth", "fwidthCoarse", "fwidthFine",
		"greaterThan", "greaterThanEqual", "groupMemoryBarrier",
		"imageAtomicAdd", "imageAtomicAnd", "imageAtomicCompSwap", "imageAtomicExchange", "imageAtomicMax", "imageAtomicMin", "imageAtomicOr", "imageAtomicXor",
		"imageLoad", "imageSamples", "imageSize", "imageStore", "imulExtended", "int16BitsToFloat16", "intBitsToFloat", "interpolateAtOffset", "interpolateAtCentroid", "interpolateAtSample",
		"inverse", "inversesqrt", "isinf", "isnan", "ldexp", "length", "lessThan", "lessThanEqual", "log", "log2",
		"matrixCompMult", "max", "memoryBarrier", "memoryBarrierAtomicCounter", "memoryBarrierBuffer", "memoryBarrierImage", "memoryBarrierShared",
		"min", "mix", "mod", "modf", "noise", "noise1", "noise2", "noise3", "noise4", "normalize", "not", "notEqual",
		"outerProduct", "packDouble2x32", "packHalf2x16", "packInt2x16", "packInt4x16", "packSnorm2x16", "packSnorm4x8",
		"packUint2x16", "packUint4x16", "packUnorm2x16", "packUnorm4x8", "pow",
		"radians", "reflect", "refract", "round", "roundEven", "sign", "sin", "sinh", "smoothstep", "sqrt", "step",
		"tan", "tanh", "texelFetch", "texelFetchOffset", "texture", "textureGather", "textureGatherOffset", "textureGatherOffsets",
		"textureGrad", "textureGradOffset", "textureLod", "textureLodOffset", "textureOffset", "textureProj", "textureProjGrad",
		"textureProjGradOffset", "textureProjLod", "textureProjLodOffset", "textureProjOffset", "textureQueryLevels", "textureQueryLod", "textureSamples", "textureSize",
		"transpose", "trunc", "uaddCarry", "uint16BitsToFloat16", "uintBitsToFloat", "umulExtended", "unpackDouble2x32", "unpackHalf2x16", "unpackInt2x16", "unpackInt4x16",
		"unpackSnorm2x16", "unpackSnorm4x8", "unpackUint2x16", "unpackUint4x16", "unpackUnorm2x16", "unpackUnorm4x8", "usubBorrow",

		"active", "asm", "atomic_uint", "attribute", "bool", "break", "buffer",
		"bvec2", "bvec3", "bvec4", "case", "cast", "centroid", "class", "coherent", "common", "const", "continue", "default", "discard",
		"dmat2", "dmat2x2", "dmat2x3", "dmat2x4", "dmat3", "dmat3x2", "dmat3x3", "dmat3x4", "dmat4", "dmat4x2", "dmat4x3", "dmat4x4",
		"do", "double", "dvec2", "dvec3", "dvec4", "else", "enum", "extern", "external", "false", "filter", "fixed", "flat", "float",
		"for", "fvec2", "fvec3", "fvec4", "goto", "half", "highp", "hvec2", "hvec3", "hvec4", "if", "iimage1D", "iimage1DArray",
		"iimage2D", "iimage2DArray", "iimage2DMS", "iimage2DMSArray", "iimage2DRect", "iimage3D", "iimageBuffer", "iimageCube",
		"iimageCubeArray", "image1D", "image1DArray", "image2D", "image2DArray", "image2DMS", "image2DMSArray", "image2DRect",
		"image3D", "imageBuffer", "imageCube", "imageCubeArray", "in", "inline", "inout", "input", "int", "interface", "invariant",
		"isampler1D", "isampler1DArray", "isampler2D", "isampler2DArray", "isampler2DMS", "isampler2DMSArray", "isampler2DRect",
		"isampler3D", "isamplerBuffer", "isamplerCube", "isamplerCubeArray", "ivec2", "ivec3", "ivec4", "layout", "long", "lowp",
		"mat2", "mat2x2", "mat2x3", "mat2x4", "mat3", "mat3x2", "mat3x3", "mat3x4", "mat4", "mat4x2", "mat4x3", "mat4x4", "mediump",
		"namespace", "noinline", "noperspective", "out", "output", "packed", "partition", "patch", "precise", "precision", "public", "readonly",
		"resource", "restrict", "return", "sample", "sampler1D", "sampler1DArray", "sampler1DArrayShadow",
		"sampler1DShadow", "sampler2D", "sampler2DArray", "sampler2DArrayShadow", "sampler2DMS", "sampler2DMSArray",
		"sampler2DRect", "sampler2DRectShadow", "sampler2DShadow", "sampler3D", "sampler3DRect", "samplerBuffer",
		"samplerCube", "samplerCubeArray", "samplerCubeArrayShadow", "samplerCubeShadow", "shared", "short", "sizeof", "smooth", "static",
		"struct", "subroutine", "superp", "switch", "template", "this", "true", "typedef", "uimage1D", "uimage1DArray", "uimage2D",
		"uimage2DArray", "uimage2DMS", "uimage2DMSArray", "uimage2DRect", "uimage3D", "uimageBuffer", "uimageCube",
		"uimageCubeArray", "uint", "uniform", "union", "unsigned", "usampler1D", "usampler1DArray", "usampler2D", "usampler2DArray",
		"usampler2DMS", "usampler2DMSArray", "usampler2DRect", "usampler3D", "usamplerBuffer", "usamplerCube",
		"usamplerCubeArray", "using", "uvec2", "uvec3", "uvec4", "varying", "vec2", "vec3", "vec4", "void", "volatile",
		"while", "writeonly",
	};
	// clang-format on

	replace_illegal_names(keywords);
}